

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::PrintTopLevelDecl
          (ForwardDeclarations *this,Formatter *format,Options *options)

{
  _Base_ptr p_Var1;
  Options *in_RCX;
  _Rb_tree_header *p_Var2;
  string local_50;
  
  p_Var1 = (this->classes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->classes_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      QualifiedClassName_abi_cxx11_(&local_50,*(cpp **)(p_Var1 + 2),(Descriptor *)options,in_RCX);
      Formatter::operator()
                (format,"template<> $dllexport_decl $$1$* Arena::CreateMaybeMessage<$1$>(Arena*);\n"
                 ,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void PrintTopLevelDecl(const Formatter& format,
                         const Options& options) const {
    for (const auto& pair : classes_) {
      format(
          "template<> $dllexport_decl $"
          "$1$* Arena::CreateMaybeMessage<$1$>(Arena*);\n",
          QualifiedClassName(pair.second, options));
    }
  }